

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O0

double __thiscall Polynomial::func(Polynomial *this,double x)

{
  long *in_RDI;
  float fVar1;
  double __x;
  __type _Var2;
  int i_1;
  int i;
  double result;
  undefined8 in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd0;
  int local_20;
  int local_1c;
  double local_18;
  
  local_18 = 0.0;
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    for (local_1c = 0; local_1c <= *(int *)((long)in_RDI + 0x14); local_1c = local_1c + 1) {
      fVar1 = (float)(**(code **)(*in_RDI + 8))(in_RDI,local_1c);
      __x = (double)fVar1;
      _Var2 = std::pow<double,int>(__x,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      local_18 = __x * _Var2 + local_18;
    }
  }
  else {
    for (local_20 = 0; local_20 < *(int *)((long)in_RDI + 0x14); local_20 = local_20 + 1) {
      fVar1 = (float)(**(code **)(*in_RDI + 8))(in_RDI,local_20);
      _Var2 = std::pow<double,int>(in_stack_ffffffffffffffd0,(int)((ulong)(double)fVar1 >> 0x20));
      local_18 = (double)fVar1 * _Var2 + local_18;
    }
    local_18 = (double)in_RDI[1] + local_18;
  }
  return local_18;
}

Assistant:

double Polynomial::func(double x)
{
    double result = 0;
    if(!isIntercedeEnable){
        for(int i(0) ; i<=degree ; i++)
        {
            result += getResult(i)*pow(x , degree-i);
        }
    }else{
        for(int i(0) ; i<degree ; i++)
        {
            result += getResult(i)*pow(x , degree-i);
        }
        result += intercede;
    }

    return result;
}